

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O3

void gen_mir(c2m_ctx_t c2m_ctx,node_t_conflict r)

{
  MIR_context_t ctx;
  gen_ctx_conflict *pgVar1;
  node_t_conflict pnVar2;
  type *type;
  func_type *func_type;
  gen_ctx_conflict *pgVar3;
  void *pvVar4;
  uint uVar5;
  gen_ctx_conflict *pgVar6;
  HTAB_reg_var_t *pHVar7;
  VARR_HTAB_EL_reg_var_t *pVVar8;
  HTAB_EL_reg_var_t *pHVar9;
  VARR_htab_ind_t *pVVar10;
  htab_ind_t *phVar11;
  VARR_MIR_var_t *pVVar12;
  MIR_var_t *pMVar13;
  VARR_MIR_type_t *pVVar14;
  MIR_type_t *pMVar15;
  HTAB_MIR_item_t *pHVar16;
  VARR_HTAB_EL_MIR_item_t *pVVar17;
  HTAB_EL_MIR_item_t *pHVar18;
  code *pcVar19;
  VARR_MIR_op_t *pVVar20;
  MIR_op_t *pMVar21;
  VARR_case_t *pVVar22;
  case_t_conflict *ppcVar23;
  VARR_init_el_t *pVVar24;
  init_el_t *piVar25;
  VARR_node_t *pVVar26;
  node_t_conflict *ppnVar27;
  ulong uVar28;
  int iVar29;
  char *pcVar30;
  MIR_item_t_conflict *ppMVar31;
  size_t sVar32;
  node_t pnVar33;
  ulong uVar34;
  bool bVar35;
  MIR_item *el;
  MIR_item pi;
  MIR_proto p;
  MIR_item_t local_168;
  node_t_conflict local_160;
  undefined1 local_158 [64];
  anon_union_8_10_166bea1d_for_u local_118;
  undefined1 local_110 [8];
  undefined4 local_108;
  MIR_type_t *local_100;
  undefined1 local_f8;
  VARR_MIR_var_t *local_f0;
  char local_e8 [32];
  MIR_module_t local_c8;
  MIR_item_t pMStack_c0;
  MIR_item_t pMStack_b8;
  char *pcStack_b0;
  MIR_item_t pMStack_a8;
  void *pvStack_a0;
  MIR_module_t local_98;
  MIR_item_t pMStack_90;
  MIR_item_t pMStack_88;
  char *pcStack_80;
  MIR_item_t pMStack_78;
  void *pvStack_70;
  MIR_module_t local_68;
  MIR_item_t pMStack_60;
  MIR_item_t pMStack_58;
  char *pcStack_50;
  MIR_item_t pMStack_48;
  void *pvStack_40;
  
  ctx = c2m_ctx->ctx;
  local_160 = r;
  pgVar6 = (gen_ctx_conflict *)c2mir_calloc(c2m_ctx,0x1c0);
  c2m_ctx->gen_ctx = pgVar6;
  MIR_new_int_op(ctx,0);
  local_158._40_8_ = pMStack_48;
  local_158._48_8_ = pvStack_40;
  local_158._8_8_ = local_68;
  local_158._16_8_ = pMStack_60;
  local_158._24_8_ = pMStack_58;
  local_158._32_8_ = pcStack_50;
  (pgVar6->zero_op).decl = (decl_t)0x0;
  *(undefined8 *)&(pgVar6->zero_op).field_0x8 = local_158._0_8_;
  (pgVar6->zero_op).mir_op.data = local_68;
  *(MIR_item_t *)&(pgVar6->zero_op).mir_op.field_0x8 = pMStack_60;
  (pgVar6->zero_op).mir_op.u.i = (int64_t)pMStack_58;
  (pgVar6->zero_op).mir_op.u.i = (int64_t)pMStack_58;
  (pgVar6->zero_op).mir_op.u.str.s = pcStack_50;
  *(MIR_item_t *)((long)&(pgVar6->zero_op).mir_op.u + 0x10) = pMStack_48;
  (pgVar6->zero_op).mir_op.u.mem.disp = (MIR_disp_t)pvStack_40;
  MIR_new_int_op(ctx,1);
  local_158._40_8_ = pMStack_78;
  local_158._48_8_ = pvStack_70;
  local_158._8_8_ = local_98;
  local_158._16_8_ = pMStack_90;
  local_158._24_8_ = pMStack_88;
  local_158._32_8_ = pcStack_80;
  (pgVar6->one_op).decl = (decl_t)0x0;
  *(undefined8 *)&(pgVar6->one_op).field_0x8 = local_158._0_8_;
  (pgVar6->one_op).mir_op.data = local_98;
  *(MIR_item_t *)&(pgVar6->one_op).mir_op.field_0x8 = pMStack_90;
  (pgVar6->one_op).mir_op.u.i = (int64_t)pMStack_88;
  (pgVar6->one_op).mir_op.u.i = (int64_t)pMStack_88;
  (pgVar6->one_op).mir_op.u.str.s = pcStack_80;
  *(MIR_item_t *)((long)&(pgVar6->one_op).mir_op.u + 0x10) = pMStack_78;
  (pgVar6->one_op).mir_op.u.mem.disp = (MIR_disp_t)pvStack_70;
  MIR_new_int_op(ctx,-1);
  pcVar30 = (char *)0x40;
  local_158._40_8_ = pMStack_a8;
  local_158._48_8_ = pvStack_a0;
  local_158._8_8_ = local_c8;
  local_158._16_8_ = pMStack_c0;
  local_158._24_8_ = pMStack_b8;
  local_158._32_8_ = pcStack_b0;
  (pgVar6->minus_one_op).decl = (decl_t)0x0;
  *(undefined8 *)&(pgVar6->minus_one_op).field_0x8 = local_158._0_8_;
  (pgVar6->minus_one_op).mir_op.data = local_c8;
  *(MIR_item_t *)&(pgVar6->minus_one_op).mir_op.field_0x8 = pMStack_c0;
  (pgVar6->minus_one_op).mir_op.u.i = (int64_t)pMStack_b8;
  (pgVar6->minus_one_op).mir_op.u.i = (int64_t)pMStack_b8;
  (pgVar6->minus_one_op).mir_op.u.str.s = pcStack_b0;
  *(MIR_item_t *)((long)&(pgVar6->minus_one_op).mir_op.u + 0x10) = pMStack_a8;
  (pgVar6->minus_one_op).mir_op.u.mem.disp = (MIR_disp_t)pvStack_a0;
  pgVar1 = c2m_ctx->gen_ctx;
  pgVar1->reg_free_mark = 0;
  pHVar7 = (HTAB_reg_var_t *)malloc(0x40);
  if (pHVar7 == (HTAB_reg_var_t *)0x0) {
LAB_00178fc3:
    mir_htab_error(pcVar30);
  }
  pcVar30 = &DAT_00000018;
  pVVar8 = (VARR_HTAB_EL_reg_var_t *)malloc(0x18);
  pHVar7->els = pVVar8;
  if (pVVar8 == (VARR_HTAB_EL_reg_var_t *)0x0) goto LAB_00178fb9;
  pVVar8->els_num = 0;
  pVVar8->size = 0x80;
  pHVar9 = (HTAB_EL_reg_var_t *)malloc(0xc00);
  pVVar8->varr = pHVar9;
  if (pHVar9 == (HTAB_EL_reg_var_t *)0x0) {
LAB_00178fd2:
    gen_mir_cold_22();
LAB_00178fd7:
    gen_mir_cold_20();
LAB_00178fdc:
    gen_mir_cold_4();
LAB_00178fe4:
    gen_mir_cold_3();
LAB_00178fe9:
    gen_mir_cold_2();
LAB_00178fee:
    gen_mir_cold_1();
LAB_00178ff3:
    gen_mir_cold_5();
LAB_00178ffb:
    gen_mir_cold_6();
LAB_00179003:
    gen_mir_cold_7();
LAB_0017900b:
    gen_mir_cold_8();
LAB_00179013:
    gen_mir_cold_9();
LAB_0017901b:
    gen_mir_cold_10();
  }
  else {
    pcVar30 = &DAT_00000018;
    pVVar8->size = 0x80;
    pVVar8->els_num = 0x80;
    pVVar10 = (VARR_htab_ind_t *)malloc(0x18);
    pHVar7->entries = pVVar10;
    if (pVVar10 == (VARR_htab_ind_t *)0x0) goto LAB_00178fb9;
    pVVar10->els_num = 0;
    pVVar10->size = 0x100;
    phVar11 = (htab_ind_t *)malloc(0x400);
    sVar32 = 0x100;
    iVar29 = 0x100;
    pHVar7->arg = (void *)0x0;
    pVVar10->varr = phVar11;
    pHVar7->hash_func = reg_var_hash;
    pHVar7->eq_func = reg_var_eq;
    pHVar7->free_func = (_func_void_reg_var_t_void_ptr *)0x0;
    pHVar7->els_num = 0;
    pHVar7->els_start = 0;
    pHVar7->els_bound = 0;
    pHVar7->collisions = 0;
    uVar34 = 0;
    do {
      if (phVar11 == (htab_ind_t *)0x0) {
        gen_mir_cold_21();
        goto LAB_00178f6c;
      }
      uVar28 = uVar34 + 1;
      if (sVar32 < uVar28) {
        sVar32 = (uVar28 >> 1) + uVar28;
        phVar11 = (htab_ind_t *)realloc(phVar11,sVar32 * 4);
        pVVar10->varr = phVar11;
        pVVar10->size = sVar32;
        uVar34 = pVVar10->els_num;
        uVar28 = uVar34 + 1;
      }
      iVar29 = iVar29 + -1;
      phVar11[uVar34] = 0xffffffff;
      pVVar10->els_num = uVar28;
      uVar34 = uVar28;
    } while (iVar29 != 0);
    pcVar30 = &DAT_00000018;
    pgVar1->reg_var_tab = pHVar7;
    pVVar12 = (VARR_MIR_var_t *)malloc(0x18);
    (pgVar6->proto_info).arg_vars = pVVar12;
    if (pVVar12 == (VARR_MIR_var_t *)0x0) goto LAB_00178fb9;
    pVVar12->els_num = 0;
    pVVar12->size = 0x20;
    pMVar13 = (MIR_var_t *)malloc(0x300);
    pcVar30 = &DAT_00000018;
    pVVar12->varr = pMVar13;
    pVVar14 = (VARR_MIR_type_t *)malloc(0x18);
    (pgVar6->proto_info).ret_types = pVVar14;
    if (pVVar14 == (VARR_MIR_type_t *)0x0) goto LAB_00178fb9;
    pVVar14->els_num = 0;
    pVVar14->size = 0x10;
    pMVar15 = (MIR_type_t *)malloc(0x40);
    pVVar14->varr = pMVar15;
    pcVar30 = (char *)0x40;
    pgVar1 = c2m_ctx->gen_ctx;
    pgVar1->curr_mir_proto_num = 0;
    pHVar16 = (HTAB_MIR_item_t *)malloc(0x40);
    if (pHVar16 == (HTAB_MIR_item_t *)0x0) goto LAB_00178fc3;
    pcVar30 = &DAT_00000018;
    pVVar17 = (VARR_HTAB_EL_MIR_item_t *)malloc(0x18);
    pHVar16->els = pVVar17;
    if (pVVar17 == (VARR_HTAB_EL_MIR_item_t *)0x0) goto LAB_00178fb9;
    pVVar17->els_num = 0;
    pVVar17->size = 0x200;
    pHVar18 = (HTAB_EL_MIR_item_t *)malloc(0x2000);
    pVVar17->varr = pHVar18;
    if (pHVar18 == (HTAB_EL_MIR_item_t *)0x0) goto LAB_00178fd7;
    pcVar30 = &DAT_00000018;
    pVVar17->size = 0x200;
    pVVar17->els_num = 0x200;
    pVVar10 = (VARR_htab_ind_t *)malloc(0x18);
    pHVar16->entries = pVVar10;
    if (pVVar10 == (VARR_htab_ind_t *)0x0) goto LAB_00178fb9;
    pVVar10->els_num = 0;
    pVVar10->size = 0x400;
    phVar11 = (htab_ind_t *)malloc(0x1000);
    sVar32 = 0x400;
    iVar29 = 0x400;
    pHVar16->arg = (void *)0x0;
    pVVar10->varr = phVar11;
    pHVar16->hash_func = proto_hash;
    pHVar16->eq_func = proto_eq;
    pHVar16->free_func = (_func_void_MIR_item_t_void_ptr *)0x0;
    pHVar16->els_num = 0;
    pHVar16->els_start = 0;
    pHVar16->els_bound = 0;
    pHVar16->collisions = 0;
    uVar34 = 0;
    do {
      if (phVar11 == (htab_ind_t *)0x0) goto LAB_00178f6c;
      uVar28 = uVar34 + 1;
      if (sVar32 < uVar28) {
        sVar32 = (uVar28 >> 1) + uVar28;
        phVar11 = (htab_ind_t *)realloc(phVar11,sVar32 * 4);
        pVVar10->varr = phVar11;
        pVVar10->size = sVar32;
        uVar34 = pVVar10->els_num;
        uVar28 = uVar34 + 1;
      }
      iVar29 = iVar29 + -1;
      phVar11[uVar34] = 0xffffffff;
      pVVar10->els_num = uVar28;
      uVar34 = uVar28;
    } while (iVar29 != 0);
    pgVar1->proto_tab = pHVar16;
    pVVar26 = c2m_ctx->call_nodes;
    if (pVVar26 != (VARR_node_t *)0x0) {
      uVar34 = 0;
      do {
        if (pVVar26->els_num <= uVar34) goto LAB_001789ee;
        if (pVVar26->varr == (node_t_conflict *)0x0) goto LAB_00178f76;
        pnVar2 = pVVar26->varr[uVar34];
        if (pnVar2->code != N_CALL) {
          __assert_fail("call->code == N_CALL",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                        ,0x34cb,"void gen_mir_protos(c2m_ctx_t)");
        }
        pnVar33 = (pnVar2->u).ops.head;
        if ((pnVar33->code == N_ID) &&
           (iVar29 = strcmp((pnVar33->u).s.s,"__builtin_jcall"), iVar29 == 0)) {
          pnVar33 = (node_t)(((pnVar33->op_link).next)->u).l;
        }
        type = *(type **)((long)pnVar33->attr + 0x18);
        if ((type->mode != TM_PTR) || (((type->u).ptr_type)->mode != TM_FUNC)) {
          __assert_fail("type->mode == TM_PTR && type->u.ptr_type->mode == TM_FUNC",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                        ,0x34d2,"void gen_mir_protos(c2m_ctx_t)");
        }
        set_type_layout(c2m_ctx,type);
        func_type = *(func_type **)((type->u).tag_type + 1);
        if (func_type->param_list->code != N_LIST) goto LAB_00178f7b;
        collect_args_and_func_types(c2m_ctx,func_type);
        bVar35 = true;
        if ((undefined1  [32])((undefined1  [32])*func_type & (undefined1  [32])0x1) ==
            (undefined1  [32])0x0) {
          bVar35 = (func_type->param_list->u).s.s == (char *)0x0;
        }
        pgVar3 = c2m_ctx->gen_ctx;
        local_118.func = (MIR_func_t)local_110;
        pVVar14 = (pgVar3->proto_info).ret_types;
        local_f8 = bVar35;
        if (pVVar14 == (VARR_MIR_type_t *)0x0) goto LAB_00178f71;
        local_108 = (undefined4)pVVar14->els_num;
        local_100 = pVVar14->varr;
        local_f0 = (pgVar3->proto_info).arg_vars;
        iVar29 = HTAB_MIR_item_t_do(pgVar3->proto_tab,(MIR_item_t)local_158,HTAB_FIND,&local_168);
        if (iVar29 == 0) {
          pcVar30 = local_e8;
          pgVar3->curr_mir_proto_num = pgVar3->curr_mir_proto_num + 1;
          sprintf(pcVar30,"proto%d");
          if ((pgVar3->proto_info).arg_vars == (VARR_MIR_var_t *)0x0) {
            gen_mir_cold_15();
            goto LAB_00178fc3;
          }
          pcVar19 = MIR_new_vararg_proto_arr;
          if (!bVar35) {
            pcVar19 = MIR_new_proto_arr;
          }
          local_168 = (MIR_item_t)(*pcVar19)(c2m_ctx->ctx,local_e8,local_108,local_100);
          HTAB_MIR_item_t_do(pgVar3->proto_tab,local_168,HTAB_INSERT,&local_168);
        }
        uVar34 = uVar34 + 1;
        func_type->proto_item = local_168;
        pVVar26 = c2m_ctx->call_nodes;
      } while (pVVar26 != (VARR_node_t *)0x0);
    }
    gen_mir_cold_18();
LAB_001789ee:
    pHVar16 = pgVar1->proto_tab;
    if (pHVar16->free_func != (_func_void_MIR_item_t_void_ptr *)0x0) {
      if (pHVar16->els == (VARR_HTAB_EL_MIR_item_t *)0x0) goto LAB_00178fe9;
      uVar5 = pHVar16->els_bound;
      if (uVar5 != 0) {
        pvVar4 = pHVar16->arg;
        uVar34 = 0;
        ppMVar31 = &pHVar16->els->varr->el;
        do {
          if (((HTAB_EL_MIR_item_t *)(ppMVar31 + -1))->hash != 0) {
            (*pHVar16->free_func)(*ppMVar31,pvVar4);
            uVar5 = pHVar16->els_bound;
          }
          uVar34 = uVar34 + 1;
          ppMVar31 = ppMVar31 + 2;
        } while (uVar34 < uVar5);
      }
      pHVar16->els_bound = 0;
      pHVar16->els_num = 0;
      pHVar16->els_start = 0;
      pVVar10 = pHVar16->entries;
      if (pVVar10 != (VARR_htab_ind_t *)0x0) {
        if ((int)pVVar10->els_num != 0) {
          memset(pVVar10->varr,0xff,(pVVar10->els_num & 0xffffffff) << 2);
        }
        goto LAB_00178a8a;
      }
      goto LAB_00178fee;
    }
LAB_00178a8a:
    pHVar16 = pgVar1->proto_tab;
    pVVar17 = pHVar16->els;
    if ((pVVar17 == (VARR_HTAB_EL_MIR_item_t *)0x0) || (pVVar17->varr == (HTAB_EL_MIR_item_t *)0x0))
    {
      gen_mir_cold_14();
LAB_00178fcd:
      gen_mir_cold_13();
      goto LAB_00178fd2;
    }
    free(pVVar17->varr);
    free(pVVar17);
    pHVar16->els = (VARR_HTAB_EL_MIR_item_t *)0x0;
    pHVar16 = pgVar1->proto_tab;
    pVVar10 = pHVar16->entries;
    if ((pVVar10 == (VARR_htab_ind_t *)0x0) || (pVVar10->varr == (htab_ind_t *)0x0))
    goto LAB_00178fcd;
    free(pVVar10->varr);
    free(pVVar10);
    pHVar16->entries = (VARR_htab_ind_t *)0x0;
    free(pgVar1->proto_tab);
    pcVar30 = &DAT_00000018;
    pgVar1->proto_tab = (HTAB_MIR_item_t *)0x0;
    pVVar20 = (VARR_MIR_op_t *)malloc(0x18);
    pgVar6->call_ops = pVVar20;
    if (pVVar20 == (VARR_MIR_op_t *)0x0) {
LAB_00178fb9:
      mir_varr_error(pcVar30);
    }
    pVVar20->els_num = 0;
    pVVar20->size = 0x20;
    pMVar21 = (MIR_op_t *)malloc(0x600);
    pcVar30 = &DAT_00000018;
    pVVar20->varr = pMVar21;
    pVVar20 = (VARR_MIR_op_t *)malloc(0x18);
    pgVar6->ret_ops = pVVar20;
    if (pVVar20 == (VARR_MIR_op_t *)0x0) goto LAB_00178fb9;
    pVVar20->els_num = 0;
    pVVar20->size = 8;
    pMVar21 = (MIR_op_t *)malloc(0x180);
    pcVar30 = &DAT_00000018;
    pVVar20->varr = pMVar21;
    pVVar20 = (VARR_MIR_op_t *)malloc(0x18);
    pgVar6->switch_ops = pVVar20;
    if (pVVar20 == (VARR_MIR_op_t *)0x0) goto LAB_00178fb9;
    pVVar20->els_num = 0;
    pVVar20->size = 0x80;
    pMVar21 = (MIR_op_t *)malloc(0x1800);
    pcVar30 = &DAT_00000018;
    pVVar20->varr = pMVar21;
    pVVar22 = (VARR_case_t *)malloc(0x18);
    pgVar6->switch_cases = pVVar22;
    if (pVVar22 == (VARR_case_t *)0x0) goto LAB_00178fb9;
    pVVar22->els_num = 0;
    pVVar22->size = 0x40;
    ppcVar23 = (case_t_conflict *)malloc(0x200);
    pcVar30 = &DAT_00000018;
    pVVar22->varr = ppcVar23;
    pVVar24 = (VARR_init_el_t *)malloc(0x18);
    pgVar6->init_els = pVVar24;
    if (pVVar24 == (VARR_init_el_t *)0x0) goto LAB_00178fb9;
    pVVar24->els_num = 0;
    pVVar24->size = 0x80;
    piVar25 = (init_el_t *)malloc(0x1c00);
    pcVar30 = &DAT_00000018;
    pVVar24->varr = piVar25;
    pVVar26 = (VARR_node_t *)malloc(0x18);
    pgVar6->node_stack = pVVar26;
    if (pVVar26 == (VARR_node_t *)0x0) goto LAB_00178fb9;
    pVVar26->els_num = 0;
    pVVar26->size = 8;
    ppnVar27 = (node_t_conflict *)malloc(0x40);
    pVVar26->varr = ppnVar27;
    pgVar6->memset_proto = (MIR_item_t)0x0;
    pgVar6->memset_item = (MIR_item_t)0x0;
    pgVar6->memcpy_proto = (MIR_item_t)0x0;
    pgVar6->memcpy_item = (MIR_item_t)0x0;
    pgVar1 = c2m_ctx->gen_ctx;
    gen((op_t *)local_158,c2m_ctx,local_160,(MIR_label_t)0x0,(MIR_label_t)0x0,0,(op_t *)0x0,
        (int *)0x0);
    (pgVar1->top_gen_last_op).decl = (decl_t)local_158._0_8_;
    *(undefined8 *)&(pgVar1->top_gen_last_op).field_0x8 = local_158._8_8_;
    (pgVar1->top_gen_last_op).mir_op.data = (void *)local_158._16_8_;
    *(undefined8 *)&(pgVar1->top_gen_last_op).mir_op.field_0x8 = local_158._24_8_;
    (pgVar1->top_gen_last_op).mir_op.u.i = local_158._32_8_;
    (pgVar1->top_gen_last_op).mir_op.u.str.s = (char *)local_158._40_8_;
    *(undefined8 *)((long)&(pgVar1->top_gen_last_op).mir_op.u + 0x10) = local_158._48_8_;
    (pgVar1->top_gen_last_op).mir_op.u.mem.disp = local_158._56_8_;
    pgVar1 = c2m_ctx->gen_ctx;
    if (pgVar1 == (gen_ctx_conflict *)0x0) {
      return;
    }
    pHVar7 = pgVar1->reg_var_tab;
    if (pHVar7 != (HTAB_reg_var_t *)0x0) {
      if (pHVar7->free_func != (_func_void_reg_var_t_void_ptr *)0x0) {
        HTAB_reg_var_t_clear(pHVar7);
        pHVar7 = pgVar1->reg_var_tab;
      }
      pVVar8 = pHVar7->els;
      if ((pVVar8 == (VARR_HTAB_EL_reg_var_t *)0x0) || (pVVar8->varr == (HTAB_EL_reg_var_t *)0x0))
      goto LAB_00178fdc;
      free(pVVar8->varr);
      free(pVVar8);
      pHVar7->els = (VARR_HTAB_EL_reg_var_t *)0x0;
      pHVar7 = pgVar1->reg_var_tab;
      pVVar10 = pHVar7->entries;
      if ((pVVar10 != (VARR_htab_ind_t *)0x0) && (pVVar10->varr != (htab_ind_t *)0x0)) {
        free(pVVar10->varr);
        free(pVVar10);
        pHVar7->entries = (VARR_htab_ind_t *)0x0;
        free(pgVar1->reg_var_tab);
        pgVar1->reg_var_tab = (HTAB_reg_var_t *)0x0;
        goto LAB_00178d74;
      }
      goto LAB_00178fe4;
    }
LAB_00178d74:
    pVVar12 = (pgVar1->proto_info).arg_vars;
    if (pVVar12 != (VARR_MIR_var_t *)0x0) {
      if (pVVar12->varr != (MIR_var_t *)0x0) {
        free(pVVar12->varr);
        free(pVVar12);
        (pgVar1->proto_info).arg_vars = (VARR_MIR_var_t *)0x0;
        goto LAB_00178daa;
      }
      goto LAB_00178ff3;
    }
LAB_00178daa:
    pVVar14 = (pgVar1->proto_info).ret_types;
    if (pVVar14 != (VARR_MIR_type_t *)0x0) {
      if (pVVar14->varr != (MIR_type_t *)0x0) {
        free(pVVar14->varr);
        free(pVVar14);
        (pgVar1->proto_info).ret_types = (VARR_MIR_type_t *)0x0;
        goto LAB_00178de0;
      }
      goto LAB_00178ffb;
    }
LAB_00178de0:
    pVVar20 = pgVar1->call_ops;
    if (pVVar20 != (VARR_MIR_op_t *)0x0) {
      if (pVVar20->varr != (MIR_op_t *)0x0) {
        free(pVVar20->varr);
        free(pVVar20);
        pgVar1->call_ops = (VARR_MIR_op_t *)0x0;
        goto LAB_00178e16;
      }
      goto LAB_00179003;
    }
LAB_00178e16:
    pVVar20 = pgVar1->ret_ops;
    if (pVVar20 != (VARR_MIR_op_t *)0x0) {
      if (pVVar20->varr != (MIR_op_t *)0x0) {
        free(pVVar20->varr);
        free(pVVar20);
        pgVar1->ret_ops = (VARR_MIR_op_t *)0x0;
        goto LAB_00178e4c;
      }
      goto LAB_0017900b;
    }
LAB_00178e4c:
    pVVar20 = pgVar1->switch_ops;
    if (pVVar20 != (VARR_MIR_op_t *)0x0) {
      if (pVVar20->varr != (MIR_op_t *)0x0) {
        free(pVVar20->varr);
        free(pVVar20);
        pgVar1->switch_ops = (VARR_MIR_op_t *)0x0;
        goto LAB_00178e82;
      }
      goto LAB_00179013;
    }
LAB_00178e82:
    pVVar22 = pgVar1->switch_cases;
    if (pVVar22 != (VARR_case_t *)0x0) {
      if (pVVar22->varr != (case_t_conflict *)0x0) {
        free(pVVar22->varr);
        free(pVVar22);
        pgVar1->switch_cases = (VARR_case_t *)0x0;
        goto LAB_00178eb8;
      }
      goto LAB_0017901b;
    }
LAB_00178eb8:
    pVVar24 = pgVar1->init_els;
    if (pVVar24 == (VARR_init_el_t *)0x0) {
LAB_00178eee:
      pVVar26 = pgVar1->node_stack;
      if (pVVar26 == (VARR_node_t *)0x0) {
LAB_00178f24:
        free(c2m_ctx->gen_ctx);
        return;
      }
      if (pVVar26->varr != (node_t_conflict *)0x0) {
        free(pVVar26->varr);
        free(pVVar26);
        pgVar1->node_stack = (VARR_node_t *)0x0;
        goto LAB_00178f24;
      }
      goto LAB_0017902b;
    }
    if (pVVar24->varr != (init_el_t *)0x0) {
      free(pVVar24->varr);
      free(pVVar24);
      pgVar1->init_els = (VARR_init_el_t *)0x0;
      goto LAB_00178eee;
    }
  }
  gen_mir_cold_11();
LAB_0017902b:
  gen_mir_cold_12();
  fprintf(_stderr,"%s\n","varr: no memory");
  exit(1);
LAB_00178f6c:
  gen_mir_cold_19();
LAB_00178f71:
  gen_mir_cold_16();
LAB_00178f76:
  gen_mir_cold_17();
LAB_00178f7b:
  __assert_fail("func_type->param_list->code == N_LIST",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                ,0x34d5,"void gen_mir_protos(c2m_ctx_t)");
}

Assistant:

static void gen_mir (c2m_ctx_t c2m_ctx, node_t r) {
  gen_ctx_t gen_ctx;
  MIR_context_t ctx = c2m_ctx->ctx;

  c2m_ctx->gen_ctx = gen_ctx = c2mir_calloc (c2m_ctx, sizeof (struct gen_ctx));
  zero_op = new_op (NULL, MIR_new_int_op (ctx, 0));
  one_op = new_op (NULL, MIR_new_int_op (ctx, 1));
  minus_one_op = new_op (NULL, MIR_new_int_op (ctx, -1));
  init_reg_vars (c2m_ctx);
  VARR_CREATE (MIR_var_t, proto_info.arg_vars, 32);
  VARR_CREATE (MIR_type_t, proto_info.ret_types, 16);
  gen_mir_protos (c2m_ctx);
  VARR_CREATE (MIR_op_t, call_ops, 32);
  VARR_CREATE (MIR_op_t, ret_ops, 8);
  VARR_CREATE (MIR_op_t, switch_ops, 128);
  VARR_CREATE (case_t, switch_cases, 64);
  VARR_CREATE (init_el_t, init_els, 128);
  VARR_CREATE (node_t, node_stack, 8);
  memset_proto = memset_item = memcpy_proto = memcpy_item = NULL;
  top_gen (c2m_ctx, r, NULL, NULL, NULL);
  gen_finish (c2m_ctx);
}